

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall
Hospital::Existence_Of_Id_For_Nurses
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  __type _Var1;
  size_type sVar2;
  reference this_00;
  reference __lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  int local_2c;
  string *psStack_28;
  int i;
  string *id_local;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  Hospital *this_local;
  
  local_2c = 0;
  psStack_28 = id;
  id_local = (string *)All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)this;
  sVar2 = std::vector<Nurse,_std::allocator<Nurse>_>::size(All_Of_Nurses);
  if (sVar2 != 0) {
    this_00 = std::vector<Nurse,_std::allocator<Nurse>_>::operator[](All_Of_Nurses,(long)local_2c);
    Nurse::nurse_all_ino_getter_abi_cxx11_(&local_48,this_00);
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_48,0);
    _Var1 = std::operator==(__lhs,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if (_Var1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Hospital :: Existence_Of_Id_For_Nurses(vector<Nurse> All_Of_Nurses , string id){
    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].nurse_all_ino_getter()[0] == id)
            return true;
        break;

    }
    return false;
}